

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector.h
# Opt level: O1

void __thiscall immutable::vector<char,_true,_5>::vector(vector<char,_true,_5> *this)

{
  atomic<unsigned_int> *paVar1;
  atomic<unsigned_int> *paVar2;
  leaf_node<char,_true> *__ptr;
  rrb<char,_true,_5> *prVar3;
  leaf_node<char,_true> *__ptr_00;
  
  prVar3 = (rrb<char,_true,_5> *)malloc(0x28);
  prVar3->cnt = 0;
  prVar3->shift = 0;
  prVar3->tail_len = 0;
  __ptr_00 = (leaf_node<char,_true> *)malloc(0x18);
  (prVar3->tail).ptr = (leaf_node<char,_true> *)0x0;
  (prVar3->root).ptr = (tree_node<char,_true> *)0x0;
  __ptr_00->type = LEAF_NODE;
  __ptr_00->len = 0;
  __ptr_00->child = (char *)0x0;
  __ptr_00->guid = 0;
  LOCK();
  (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  LOCK();
  (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i =
       (__ptr_00->_ref_count).super___atomic_base<unsigned_int>._M_i + 1;
  UNLOCK();
  paVar1 = &__ptr_00->_ref_count;
  __ptr = (prVar3->tail).ptr;
  (prVar3->tail).ptr = __ptr_00;
  if (__ptr != (leaf_node<char,_true> *)0x0) {
    LOCK();
    paVar2 = &__ptr->_ref_count;
    (paVar2->super___atomic_base<unsigned_int>)._M_i =
         (paVar2->super___atomic_base<unsigned_int>)._M_i - 1;
    UNLOCK();
    if ((paVar2->super___atomic_base<unsigned_int>)._M_i == 0) {
      free(__ptr);
    }
  }
  LOCK();
  (paVar1->super___atomic_base<unsigned_int>)._M_i =
       (paVar1->super___atomic_base<unsigned_int>)._M_i - 1;
  UNLOCK();
  if ((paVar1->super___atomic_base<unsigned_int>)._M_i == 0) {
    free(__ptr_00);
  }
  (this->_impl).ptr = prVar3;
  LOCK();
  (prVar3->_ref_count).super___atomic_base<unsigned_int>._M_i = 1;
  UNLOCK();
  return;
}

Assistant:

vector() = default;